

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O2

Maybe<capnp::compiler::BrandedDecl> * __thiscall
capnp::compiler::BrandedDecl::getMember
          (Maybe<capnp::compiler::BrandedDecl> *__return_storage_ptr__,BrandedDecl *this,
          StringPtr memberName,Reader subSource)

{
  long *plVar1;
  NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  _r64;
  BrandedDecl local_138;
  NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  local_90;
  
  if ((this->body).tag != 2) {
    plVar1 = *(long **)((long)&(this->body).field_1 + 0x20);
    (**(code **)(*plVar1 + 8))(&local_138,plVar1,memberName.content.ptr,memberName.content.size_);
    kj::_::
    NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
    ::NullableValue(&local_90,
                    (NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
                     *)&local_138);
    if (local_90.isSet == true) {
      BrandScope::interpretResolve
                (&local_138,(this->brand).ptr,*(Resolver **)((long)&(this->body).field_1 + 0x20),
                 &local_90.field_1.value,subSource);
      kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
                (&__return_storage_ptr__->ptr,&local_138);
      ~BrandedDecl(&local_138);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->ptr).isSet = false;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<BrandedDecl> BrandedDecl::getMember(
    kj::StringPtr memberName, Expression::Reader subSource) {
  if (body.is<Resolver::ResolvedParameter>()) {
    return kj::none;
  } else KJ_IF_SOME(r, body.get<Resolver::ResolvedDecl>().resolver->resolveMember(memberName)) {
    return brand->interpretResolve(*body.get<Resolver::ResolvedDecl>().resolver, r, subSource);
  } else {
    return kj::none;
  }